

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFile.cpp
# Opt level: O2

ExistingFileNamer * __thiscall
ApprovalTests::ExistingFile::getNamer(ExistingFileNamer *__return_storage_ptr__,ExistingFile *this)

{
  string sStack_38;
  
  ::std::__cxx11::string::string((string *)&sStack_38,(string *)&this->filePath);
  ExistingFileNamer::ExistingFileNamer(__return_storage_ptr__,&sStack_38,this->options_);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

ExistingFileNamer ExistingFile::getNamer()
    {
        return ExistingFileNamer(filePath, options_);
    }